

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O3

t_int * sigczero_rev_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  long lVar3;
  t_int tVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  lVar3 = w[7];
  tVar4 = w[8];
  fVar14 = *(float *)(lVar3 + 0x34);
  fVar15 = *(float *)(lVar3 + 0x38);
  if (0 < (int)tVar4) {
    lVar5 = w[6];
    lVar6 = w[5];
    lVar7 = w[4];
    lVar8 = w[3];
    lVar9 = w[1];
    lVar10 = w[2];
    lVar11 = 0;
    fVar12 = fVar15;
    fVar13 = fVar14;
    do {
      fVar14 = *(float *)(lVar9 + lVar11 * 4);
      fVar15 = *(float *)(lVar10 + lVar11 * 4);
      fVar1 = *(float *)(lVar8 + lVar11 * 4);
      fVar2 = *(float *)(lVar7 + lVar11 * 4);
      *(float *)(lVar6 + lVar11 * 4) = (fVar13 - fVar14 * fVar1) - fVar15 * fVar2;
      *(float *)(lVar5 + lVar11 * 4) = fVar1 * fVar15 + (fVar12 - fVar2 * fVar14);
      lVar11 = lVar11 + 1;
      fVar12 = fVar15;
      fVar13 = fVar14;
    } while ((int)tVar4 != (int)lVar11);
  }
  *(float *)(lVar3 + 0x34) = fVar14;
  *(float *)(lVar3 + 0x38) = fVar15;
  return w + 9;
}

Assistant:

static t_int *sigczero_rev_perform(t_int *w)
{
    t_sample *inre1 = (t_sample *)(w[1]);
    t_sample *inim1 = (t_sample *)(w[2]);
    t_sample *inre2 = (t_sample *)(w[3]);
    t_sample *inim2 = (t_sample *)(w[4]);
    t_sample *outre = (t_sample *)(w[5]);
    t_sample *outim = (t_sample *)(w[6]);
    t_sigczero_rev *x = (t_sigczero_rev *)(w[7]);
    int n = (int)w[8];
    int i;
    t_sample lastre = x->x_lastre;
    t_sample lastim = x->x_lastim;
    for (i = 0; i < n; i++)
    {
        t_sample nextre = *inre1++;
        t_sample nextim = *inim1++;
        t_sample coefre = *inre2++;
        t_sample coefim = *inim2++;
            /* transfer function is (A bar) - Z^-1, for the same
            frequency response as 1 - AZ^-1 from czero_tilde. */
        *outre++ = lastre - nextre * coefre - nextim * coefim;
        *outim++ = lastim - nextre * coefim + nextim * coefre;
        lastre = nextre;
        lastim = nextim;
    }
    x->x_lastre = lastre;
    x->x_lastim = lastim;
    return (w+9);
}